

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O1

void recfield(LexState *ls,ConsControl *cc)

{
  lu_byte lVar1;
  int a;
  FuncState *fs;
  int b;
  int c;
  TString *s;
  expdesc key;
  expdesc val;
  expdesc local_60;
  expdesc local_48;
  
  fs = ls->fs;
  lVar1 = fs->freereg;
  if ((ls->t).token == 0x124) {
    s = str_checkname(ls);
    local_60.u.info = luaK_stringK(ls->fs,s);
    local_60.t = -1;
    local_60.f = -1;
    local_60.k = VK;
  }
  else {
    yindex(ls,&local_60);
  }
  cc->nh = cc->nh + 1;
  checknext(ls,0x3d);
  b = luaK_exp2RK(fs,&local_60);
  subexpr(ls,&local_48,0);
  a = (cc->t->u).info;
  c = luaK_exp2RK(fs,&local_48);
  luaK_codeABC(fs,OP_SETTABLE,a,b,c);
  fs->freereg = lVar1;
  return;
}

Assistant:

static void recfield (LexState *ls, ConsControl *cc) {
  /* recfield -> (NAME | '['exp']') = exp */
  FuncState *fs = ls->fs;
  int reg = ls->fs->freereg;
  expdesc tab, key, val;
  if (ls->t.token == TK_NAME) {
    checklimit(fs, cc->nh, MAX_INT, "items in a constructor");
    codename(ls, &key);
  }
  else  /* ls->t.token == '[' */
    yindex(ls, &key);
  cc->nh++;
  checknext(ls, '=');
  tab = *cc->t;
  luaK_indexed(fs, &tab, &key);
  expr(ls, &val);
  luaK_storevar(fs, &tab, &val);
  fs->freereg = reg;  /* free registers */
}